

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

void __thiscall Minisat::Solver::removeClause(Solver *this,CRef cr,bool remove_from_proof)

{
  uint64_t *puVar1;
  uint uVar2;
  VarData *pVVar3;
  OnlineProofChecker *this_00;
  bool bVar4;
  int iVar5;
  undefined7 in_register_00000011;
  anon_struct_8_10_eb538618_for_header *paVar6;
  anon_struct_8_10_eb538618_for_header *c;
  lbool local_2e;
  lbool local_2d;
  Lit local_2c;
  
  c = (anon_struct_8_10_eb538618_for_header *)
      ((this->ca).super_RegionAllocator<unsigned_int>.memory + cr);
  puVar1 = &(this->statistics).solveSteps;
  *puVar1 = *puVar1 + 1;
  detachClause(this,cr,false);
  if ((int)CONCAT71(in_register_00000011,remove_from_proof) != 0) {
    bVar4 = locked(this,(Clause *)c);
    if (bVar4) {
      paVar6 = c + 1;
      if (SUB84(*c,4) >> 2 == 2) {
        local_2d.value =
             (byte)*(int *)(c + 1) & 1 ^ (this->assigns).data[*(int *)(c + 1) >> 1].value;
        bVar4 = lbool::operator==(&local_2d,(lbool)0x0);
        if (!bVar4) {
          paVar6 = (anon_struct_8_10_eb538618_for_header *)&c[1].field_0x4;
        }
      }
      uVar2 = *(uint *)paVar6;
      iVar5 = (int)uVar2 >> 1;
      pVVar3 = (this->vardata).data;
      pVVar3[iVar5].reason = 0xffffffff;
      if (((this->drup_file != (FILE *)0x0) &&
          (this_00 = this->onlineDratChecker, this_00 != (OnlineProofChecker *)0x0)) &&
         (pVVar3[iVar5].level == 0)) {
        local_2e.value = (this->assigns).data[iVar5].value;
        bVar4 = lbool::operator==(&local_2e,(lbool)0x1);
        local_2c.x = (uint)bVar4 | uVar2 & 0xfffffffe;
        bVar4 = OnlineProofChecker::addClause(this_00,&local_2c);
        if (!bVar4) {
          exit(0x86);
        }
      }
    }
    if (this->drup_file != (FILE *)0x0) {
      if (((ulong)*c & 3) == 1) {
        if (0 < this->verbosity) {
          puts("c Bug. I don\'t expect this to happen.");
        }
      }
      else {
        binDRUP<Minisat::Clause>(this,'d',(Clause *)c,this->drup_file);
      }
    }
  }
  *c = (anon_struct_8_10_eb538618_for_header)(((ulong)*c & 0xfffffffffffffffc) + 1);
  ClauseAllocator::free(&this->ca,(void *)(ulong)cr);
  return;
}

Assistant:

void Solver::removeClause(CRef cr, bool remove_from_proof)
{
    Clause &c = ca[cr];
    statistics.solveSteps++;

    detachClause(cr);
    // Don't leave pointers to free'd memory!
    if (remove_from_proof) {
        if (locked(c)) {
            Lit implied = c.size() != 2 ? c[0] : (value(c[0]) == l_True ? c[0] : c[1]);
            vardata[var(implied)].reason = CRef_Undef;
            if (drup_file && onlineDratChecker && level(var(implied)) == 0) { /* before we drop the reason, store a unit */
                if (!onlineDratChecker->addClause(mkLit(var(implied), value(var(implied)) == l_False))) exit(134);
            }
        }
        if (drup_file) {
            if (c.mark() != 1) {
#ifdef BIN_DRUP
                binDRUP('d', c, drup_file);
#else
                fprintf(drup_file, "d ");
                for (int i = 0; i < c.size(); i++) fprintf(drup_file, "%i ", (var(c[i]) + 1) * (-2 * sign(c[i]) + 1));
                fprintf(drup_file, "0\n");
#endif
            } else if (verbosity >= 1) {
                printf("c Bug. I don't expect this to happen.\n");
            }
        }
    }

    c.mark(1);
    ca.free(cr);
}